

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  __node_base_ptr *this_00;
  undefined4 uVar1;
  float fVar2;
  __node_base _Var3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int32_t iVar8;
  float fVar9;
  SPIRType *pSVar10;
  _Hash_node_base *p_Var11;
  int64_t iVar12;
  CompilerError *pCVar13;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  SPIRConstant *this_01;
  char *pcVar14;
  byte local_cc2;
  byte local_c8e;
  bool local_b51;
  bool local_b49;
  undefined1 local_b28 [40];
  uint32_t i_14;
  string local_ae0 [32];
  undefined1 local_ac0 [40];
  uint32_t i_13;
  uint8_t local_a71;
  spirv_cross local_a70 [32];
  string local_a50 [32];
  undefined1 local_a30 [40];
  uint32_t i_12;
  int16_t local_9e2;
  spirv_cross local_9e0 [32];
  string local_9c0 [38];
  int16_t local_99a;
  spirv_cross local_998 [32];
  undefined1 local_978 [40];
  uint32_t i_11;
  uint16_t local_92a;
  spirv_cross local_928 [32];
  string local_908 [38];
  uint16_t local_8e2;
  spirv_cross local_8e0 [32];
  undefined1 local_8c0 [40];
  uint32_t i_10;
  spirv_cross local_878 [32];
  undefined1 local_858 [44];
  uint32_t i_9;
  byte local_80b;
  byte local_80a;
  allocator local_809;
  string local_808 [36];
  uint32_t local_7e4;
  spirv_cross local_7e0 [32];
  undefined1 local_7c0 [32];
  float local_7a0;
  byte local_79b;
  byte local_79a;
  allocator local_799;
  uint32_t i_8;
  uint32_t local_774;
  spirv_cross local_770 [32];
  TypedID<(spirv_cross::Types)0> *local_750;
  spirv_cross local_748 [32];
  undefined1 local_728 [44];
  uint32_t i_7;
  spirv_cross local_6f8 [32];
  spirv_cross local_6d8 [32];
  undefined1 local_6b8 [44];
  uint32_t i_6;
  string local_670 [8];
  string int64_type;
  undefined1 local_650 [8];
  SPIRType tmp;
  undefined1 local_4d0 [40];
  undefined1 local_4a8 [4];
  uint32_t i_5;
  undefined1 local_488 [32];
  undefined1 local_468 [32];
  undefined1 local_448 [40];
  undefined1 local_420 [4];
  uint32_t i_4;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [40];
  undefined1 local_398 [4];
  uint32_t i_3;
  undefined1 local_378 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [36];
  uint local_314;
  uint32_t local_310;
  uint32_t i_2;
  uint32_t ident_1;
  uint32_t i_1;
  uint64_t ident;
  bool local_2f7;
  bool local_2f6;
  char local_2f5;
  uint32_t i;
  bool swizzle_splat;
  bool splat;
  undefined1 local_2e8 [8];
  SPIRType scalar_type;
  SPIRType type;
  uint32_t vector_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  this_01 = (SPIRConstant *)CONCAT44(in_register_00000014,vector);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this_01->super_IVariant).field_0xc);
  pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
  this_00 = &scalar_type.member_name_cache._M_h._M_single_bucket;
  SPIRType::SPIRType((SPIRType *)this_00,pSVar10);
  SPIRType::SPIRType((SPIRType *)local_2e8,(SPIRType *)this_00);
  scalar_type.basetype = Void;
  local_2f5 = '\0';
  ::std::__cxx11::string::string((string *)this);
  local_b49 = false;
  if ((*(byte *)((long)c[0x17].m.c[2].r + 0xe) & 1) != 0) {
    uVar5 = SPIRConstant::vector_size(this_01);
    local_b49 = 1 < uVar5;
  }
  local_2f6 = local_b49;
  local_b51 = false;
  if (((ulong)c[0x17].m.c[2].r[2] & 1) != 0) {
    uVar5 = SPIRConstant::vector_size(this_01);
    local_b51 = 1 < uVar5;
  }
  local_2f7 = local_b51;
  bVar4 = type_is_floating_point((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  if (!bVar4) {
    local_2f7 = false;
  }
  if (((local_2f6 & 1U) != 0) || ((local_2f7 & 1U) != 0)) {
    for (ident._4_4_ = 0; uVar7 = ident._4_4_, uVar5 = SPIRConstant::vector_size(this_01),
        uVar7 < uVar5; ident._4_4_ = ident._4_4_ + 1) {
      uVar5 = SPIRConstant::specialization_constant_id(this_01,in_ECX,ident._4_4_);
      if (uVar5 != 0) {
        local_2f6 = false;
        local_2f7 = false;
        break;
      }
    }
  }
  if (((local_2f6 & 1U) != 0) || ((local_2f7 & 1U) != 0)) {
    if (type.super_IVariant._12_4_ == 0x40) {
      _ident_1 = (_Hash_node_base *)SPIRConstant::scalar_u64(this_01,in_ECX,0);
      for (i_2 = 1; uVar5 = i_2, uVar6 = SPIRConstant::vector_size(this_01), _Var3._M_nxt = _ident_1
          , uVar5 < uVar6; i_2 = i_2 + 1) {
        p_Var11 = (_Hash_node_base *)SPIRConstant::scalar_u64(this_01,in_ECX,i_2);
        if (_Var3._M_nxt != p_Var11) {
          local_2f6 = false;
          local_2f7 = false;
          break;
        }
      }
    }
    else {
      local_310 = SPIRConstant::scalar(this_01,in_ECX,0);
      for (local_314 = 1; uVar7 = local_314, uVar6 = SPIRConstant::vector_size(this_01),
          uVar5 = local_310, uVar7 < uVar6; local_314 = local_314 + 1) {
        uVar6 = SPIRConstant::scalar(this_01,in_ECX,local_314);
        if (uVar5 != uVar6) {
          local_2f6 = false;
          local_2f7 = false;
        }
      }
    }
  }
  uVar5 = SPIRConstant::vector_size(this_01);
  if ((1 < uVar5) && ((local_2f7 & 1U) == 0)) {
    (*(c->super_IVariant)._vptr_IVariant[0x13])
              (local_378 + 0x20,c,&scalar_type.member_name_cache._M_h._M_single_bucket,0);
    ::std::operator+(local_338,local_378 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_338);
    ::std::__cxx11::string::~string((string *)local_338);
    ::std::__cxx11::string::~string((string *)(local_378 + 0x20));
  }
  uVar5 = (uint32_t)c;
  switch(type.super_IVariant.self.id) {
  case 2:
    if ((local_2f6 & 1U) == 0) {
      for (local_b28._32_4_ = 0; uVar1 = local_b28._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_b28._32_4_ = local_b28._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_b28._32_4_),
           uVar6 == 0)) {
          uVar6 = SPIRConstant::scalar(this_01,in_ECX,local_b28._32_4_);
          pcVar14 = "false";
          if (uVar6 != 0) {
            pcVar14 = "true";
          }
          ::std::__cxx11::string::operator+=((string *)this,pcVar14);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_b28._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_b28,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_b28);
          ::std::__cxx11::string::~string((string *)local_b28);
        }
        uVar7 = local_b28._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      uVar5 = SPIRConstant::scalar(this_01,in_ECX,0);
      pcVar14 = "false";
      if (uVar5 != 0) {
        pcVar14 = "true";
      }
      ::std::__cxx11::string::operator+=((string *)this,pcVar14);
    }
    break;
  case 3:
    if ((local_2f6 & 1U) == 0) {
      for (local_ac0._32_4_ = 0; uVar1 = local_ac0._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_ac0._32_4_ = local_ac0._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_ac0._32_4_),
           uVar6 == 0)) {
          (*(c->super_IVariant)._vptr_IVariant[0x13])(local_ae0,c,local_2e8,0);
          ::std::__cxx11::string::operator+=((string *)this,local_ae0);
          ::std::__cxx11::string::~string(local_ae0);
          ::std::__cxx11::string::operator+=((string *)this,"(");
          local_b28[0x27] = SPIRConstant::scalar_i8(this_01,in_ECX,local_ac0._32_4_);
          convert_to_string<signed_char,_0>((spirv_cross *)&i_14,local_b28 + 0x27);
          ::std::__cxx11::string::operator+=((string *)this,(string *)&i_14);
          ::std::__cxx11::string::~string((string *)&i_14);
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_ac0._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_ac0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_ac0);
          ::std::__cxx11::string::~string((string *)local_ac0);
        }
        uVar7 = local_ac0._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_ac0[0x27] = SPIRConstant::scalar_i8(this_01,in_ECX,0);
      convert_to_string<signed_char,_0>((spirv_cross *)&i_13,local_ac0 + 0x27);
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_13);
      ::std::__cxx11::string::~string((string *)&i_13);
    }
    break;
  case 4:
    if ((local_2f6 & 1U) == 0) {
      for (local_a30._32_4_ = 0; uVar1 = local_a30._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_a30._32_4_ = local_a30._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a30._32_4_),
           uVar6 == 0)) {
          (*(c->super_IVariant)._vptr_IVariant[0x13])(local_a50,c,local_2e8,0);
          ::std::__cxx11::string::operator+=((string *)this,local_a50);
          ::std::__cxx11::string::~string(local_a50);
          ::std::__cxx11::string::operator+=((string *)this,"(");
          local_a71 = SPIRConstant::scalar_u8(this_01,in_ECX,local_a30._32_4_);
          convert_to_string<unsigned_char,_0>(local_a70,&local_a71);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_a70);
          ::std::__cxx11::string::~string((string *)local_a70);
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a30._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_a30,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_a30);
          ::std::__cxx11::string::~string((string *)local_a30);
        }
        uVar7 = local_a30._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_a30[0x27] = SPIRConstant::scalar_u8(this_01,in_ECX,0);
      convert_to_string<unsigned_char,_0>((spirv_cross *)&i_12,local_a30 + 0x27);
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_12);
      ::std::__cxx11::string::~string((string *)&i_12);
    }
    break;
  case 5:
    if ((local_2f6 & 1U) == 0) {
      for (local_978._32_4_ = 0; uVar1 = local_978._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_978._32_4_ = local_978._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_978._32_4_),
           uVar6 == 0)) {
          if (**(char **)&c[0x17].m.c[0].vecsize == '\0') {
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_9c0,c,local_2e8,0);
            ::std::__cxx11::string::operator+=((string *)this,local_9c0);
            ::std::__cxx11::string::~string(local_9c0);
            ::std::__cxx11::string::operator+=((string *)this,"(");
            local_9e2 = SPIRConstant::scalar_i16(this_01,in_ECX,local_978._32_4_);
            convert_to_string<short,_0>(local_9e0,&local_9e2);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_9e0);
            ::std::__cxx11::string::~string((string *)local_9e0);
            ::std::__cxx11::string::operator+=((string *)this,")");
          }
          else {
            local_99a = SPIRConstant::scalar_i16(this_01,in_ECX,local_978._32_4_);
            convert_to_string<short,_0>(local_998,&local_99a);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_998);
            ::std::__cxx11::string::~string((string *)local_998);
            ::std::__cxx11::string::operator+=((string *)this,*(char **)&c[0x17].m.c[0].vecsize);
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_978._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_978,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_978);
          ::std::__cxx11::string::~string((string *)local_978);
        }
        uVar7 = local_978._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_978._38_2_ = SPIRConstant::scalar_i16(this_01,in_ECX,0);
      convert_to_string<short,_0>((spirv_cross *)&i_11,(short *)(local_978 + 0x26));
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_11);
      ::std::__cxx11::string::~string((string *)&i_11);
    }
    break;
  case 6:
    if ((local_2f6 & 1U) == 0) {
      for (local_8c0._32_4_ = 0; uVar1 = local_8c0._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_8c0._32_4_ = local_8c0._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_8c0._32_4_),
           uVar6 == 0)) {
          if (*(char *)c[0x17].m.c[1].r[0] == '\0') {
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_908,c,local_2e8,0);
            ::std::__cxx11::string::operator+=((string *)this,local_908);
            ::std::__cxx11::string::~string(local_908);
            ::std::__cxx11::string::operator+=((string *)this,"(");
            local_92a = SPIRConstant::scalar_u16(this_01,in_ECX,local_8c0._32_4_);
            convert_to_string<unsigned_short,_0>(local_928,&local_92a);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_928);
            ::std::__cxx11::string::~string((string *)local_928);
            ::std::__cxx11::string::operator+=((string *)this,")");
          }
          else {
            local_8e2 = SPIRConstant::scalar_u16(this_01,in_ECX,local_8c0._32_4_);
            convert_to_string<unsigned_short,_0>(local_8e0,&local_8e2);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_8e0);
            ::std::__cxx11::string::~string((string *)local_8e0);
            ::std::__cxx11::string::operator+=((string *)this,(char *)c[0x17].m.c[1].r[0]);
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_8c0._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_8c0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_8c0);
          ::std::__cxx11::string::~string((string *)local_8c0);
        }
        uVar7 = local_8c0._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_8c0._36_4_ = SPIRConstant::scalar(this_01,in_ECX,0);
      convert_to_string<unsigned_int,_0>((spirv_cross *)&i_10,(uint *)(local_8c0 + 0x24));
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_10);
      ::std::__cxx11::string::~string((string *)&i_10);
    }
    break;
  case 7:
    if ((local_2f6 & 1U) == 0) {
      for (local_858._36_4_ = 0; uVar1 = local_858._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_858._36_4_ = local_858._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_858._36_4_),
           uVar6 == 0)) {
          iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,local_858._36_4_);
          convert_to_string_abi_cxx11_(local_878,iVar8);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_878);
          ::std::__cxx11::string::~string((string *)local_878);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_858._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_858,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_858);
          ::std::__cxx11::string::~string((string *)local_858);
        }
        uVar7 = local_858._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,0);
      convert_to_string_abi_cxx11_((spirv_cross *)(local_858 + 0x28),iVar8);
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_858 + 0x28));
      ::std::__cxx11::string::~string((string *)(local_858 + 0x28));
    }
    break;
  case 8:
    if ((local_2f6 & 1U) == 0) {
      for (local_7a0 = 0.0; fVar2 = local_7a0, fVar9 = (float)SPIRConstant::vector_size(this_01),
          (uint)fVar2 < (uint)fVar9; local_7a0 = (float)((int)local_7a0 + 1)) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,(uint32_t)local_7a0),
           uVar6 == 0)) {
          local_7e4 = SPIRConstant::scalar(this_01,in_ECX,(uint32_t)local_7a0);
          convert_to_string<unsigned_int,_0>(local_7e0,&local_7e4);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_7e0);
          ::std::__cxx11::string::~string((string *)local_7e0);
          local_80a = 0;
          local_80b = 0;
          bVar4 = is_legacy((CompilerGLSL *)c);
          local_cc2 = 0;
          if (bVar4) {
            ::std::allocator<char>::allocator();
            local_80a = 1;
            ::std::__cxx11::string::string(local_808,"GL_EXT_gpu_shader4",&local_809);
            local_80b = 1;
            bVar4 = has_extension((CompilerGLSL *)c,(string *)local_808);
            local_cc2 = bVar4 ^ 0xff;
          }
          if ((local_80b & 1) != 0) {
            ::std::__cxx11::string::~string(local_808);
          }
          if ((local_80a & 1) != 0) {
            ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
          }
          if ((local_cc2 & 1) == 0) {
            if ((c[0x17].super_IVariant.self.id & 0x10000) != 0) {
              ::std::__cxx11::string::operator+=((string *)this,"u");
            }
          }
          else {
            iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,(uint32_t)local_7a0);
            if (iVar8 < 0) {
              pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar13,
                         "Tried to convert uint literal into int, but this made the literal negative."
                        );
              __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,(uint32_t)local_7a0);
          to_expression_abi_cxx11_((CompilerGLSL *)local_7c0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_7c0);
          ::std::__cxx11::string::~string((string *)local_7c0);
        }
        uVar7 = (int)local_7a0 + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_774 = SPIRConstant::scalar(this_01,in_ECX,0);
      convert_to_string<unsigned_int,_0>(local_770,&local_774);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_770);
      ::std::__cxx11::string::~string((string *)local_770);
      local_79a = 0;
      local_79b = 0;
      bVar4 = is_legacy((CompilerGLSL *)c);
      local_c8e = 0;
      if (bVar4) {
        ::std::allocator<char>::allocator();
        local_79a = 1;
        ::std::__cxx11::string::string((string *)&i_8,"GL_EXT_gpu_shader4",&local_799);
        local_79b = 1;
        bVar4 = has_extension((CompilerGLSL *)c,(string *)&i_8);
        local_c8e = bVar4 ^ 0xff;
      }
      if ((local_79b & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&i_8);
      }
      if ((local_79a & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
      }
      if ((local_c8e & 1) == 0) {
        if ((c[0x17].super_IVariant.self.id & 0x10000) != 0) {
          ::std::__cxx11::string::operator+=((string *)this,"u");
        }
      }
      else {
        iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,0);
        if (iVar8 < 0) {
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar13,
                     "Tried to convert uint literal into int, but this made the literal negative.");
          __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
    }
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)local_650,
                       (SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
    tmp.basetype = Void;
    tmp.width = 1;
    (*(c->super_IVariant)._vptr_IVariant[0x13])(local_670,c,local_650,0);
    if ((local_2f6 & 1U) == 0) {
      for (local_6b8._36_4_ = 0; uVar1 = local_6b8._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_6b8._36_4_ = local_6b8._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_6b8._36_4_),
           uVar6 == 0)) {
          iVar12 = SPIRConstant::scalar_i64(this_01,in_ECX,local_6b8._36_4_);
          convert_to_string(local_6d8,iVar12,local_670,
                            (bool)(*(byte *)((long)&c[0x17].super_IVariant.self.id + 3) & 1));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_6d8);
          ::std::__cxx11::string::~string((string *)local_6d8);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_6b8._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_6b8,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_6b8);
          ::std::__cxx11::string::~string((string *)local_6b8);
        }
        uVar7 = local_6b8._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      iVar12 = SPIRConstant::scalar_i64(this_01,in_ECX,0);
      convert_to_string((spirv_cross *)(local_6b8 + 0x28),iVar12,local_670,
                        (bool)(*(byte *)((long)&c[0x17].super_IVariant.self.id + 3) & 1));
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_6b8 + 0x28));
      ::std::__cxx11::string::~string((string *)(local_6b8 + 0x28));
    }
    ::std::__cxx11::string::~string((string *)local_670);
    SPIRType::~SPIRType((SPIRType *)local_650);
    break;
  case 10:
    if ((local_2f6 & 1U) == 0) {
      for (local_728._36_4_ = 0; uVar1 = local_728._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_728._36_4_ = local_728._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_728._36_4_),
           uVar6 == 0)) {
          local_750 = (TypedID<(spirv_cross::Types)0> *)
                      SPIRConstant::scalar_u64(this_01,in_ECX,local_728._36_4_);
          convert_to_string<unsigned_long,_0>(local_748,(unsigned_long *)&local_750);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_748);
          ::std::__cxx11::string::~string((string *)local_748);
          if ((c[0x17].super_IVariant.self.id & 0x1000000) == 0) {
            ::std::__cxx11::string::operator+=((string *)this,"ul");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)this,"ull");
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_728._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_728,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_728);
          ::std::__cxx11::string::~string((string *)local_728);
        }
        uVar7 = local_728._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      register0x00000000 = (Variant *)SPIRConstant::scalar_u64(this_01,in_ECX,0);
      convert_to_string<unsigned_long,_0>(local_6f8,(unsigned_long *)(local_728 + 0x28));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_6f8);
      ::std::__cxx11::string::~string((string *)local_6f8);
      if ((c[0x17].super_IVariant.self.id & 0x1000000) == 0) {
        ::std::__cxx11::string::operator+=((string *)this,"ul");
      }
      else {
        ::std::__cxx11::string::operator+=((string *)this,"ull");
      }
    }
    break;
  default:
    pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar13,"Invalid constant expression basetype.");
    __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xc:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_3c0._36_4_ = 0; uVar1 = local_3c0._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_3c0._36_4_ = local_3c0._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_3c0._36_4_),
           uVar6 == 0)) {
          convert_half_to_string_abi_cxx11_((CompilerGLSL *)local_3e0,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3e0);
          ::std::__cxx11::string::~string((string *)local_3e0);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_3c0._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_3c0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c0);
          ::std::__cxx11::string::~string((string *)local_3c0);
        }
        uVar7 = local_3c0._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_half_to_string_abi_cxx11_((CompilerGLSL *)local_378,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_378);
      ::std::__cxx11::string::~string((string *)local_378);
      if ((local_2f7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_398,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_398);
        ::std::__cxx11::string::~string((string *)local_398);
      }
    }
    break;
  case 0xd:
  case 0x19:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_448._36_4_ = 0; uVar1 = local_448._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_448._36_4_ = local_448._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_448._36_4_),
           uVar6 == 0)) {
          convert_float_to_string_abi_cxx11_((CompilerGLSL *)local_468,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_468);
          ::std::__cxx11::string::~string((string *)local_468);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_448._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_448,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_448);
          ::std::__cxx11::string::~string((string *)local_448);
        }
        uVar7 = local_448._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_float_to_string_abi_cxx11_((CompilerGLSL *)local_400,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_400);
      ::std::__cxx11::string::~string((string *)local_400);
      if ((local_2f7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_420,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_420);
        ::std::__cxx11::string::~string((string *)local_420);
      }
    }
    break;
  case 0xe:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_4d0._36_4_ = 0; uVar1 = local_4d0._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_4d0._36_4_ = local_4d0._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_4d0._36_4_),
           uVar6 == 0)) {
          convert_double_to_string_abi_cxx11_
                    ((CompilerGLSL *)&tmp.member_name_cache._M_h._M_single_bucket,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=
                    ((string *)this,(string *)&tmp.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string((string *)&tmp.member_name_cache._M_h._M_single_bucket);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_4d0._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_4d0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_4d0);
          ::std::__cxx11::string::~string((string *)local_4d0);
        }
        uVar7 = local_4d0._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_double_to_string_abi_cxx11_((CompilerGLSL *)local_488,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_488);
      ::std::__cxx11::string::~string((string *)local_488);
      if ((local_2f7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_4a8,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_4a8);
        ::std::__cxx11::string::~string((string *)local_4a8);
      }
    }
  }
  uVar5 = SPIRConstant::vector_size(this_01);
  if ((1 < uVar5) && ((local_2f7 & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)this,")");
  }
  local_2f5 = '\x01';
  SPIRType::~SPIRType((SPIRType *)local_2e8);
  SPIRType::~SPIRType((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  return this;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::BFloat16:
	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}